

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O0

void parse_object_should_parse_empty_objects(void)

{
  assert_parse_object("{}");
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x4f);
  }
  reset(item);
  assert_parse_object("{\n\t}");
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x53);
  }
  reset(item);
  return;
}

Assistant:

static void parse_object_should_parse_empty_objects(void)
{
    assert_parse_object("{}");
    assert_has_no_child(item);
    reset(item);

    assert_parse_object("{\n\t}");
    assert_has_no_child(item);
    reset(item);
}